

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTaskExecutor.h
# Opt level: O1

void HighsTaskExecutor::sync_stolen_task(HighsSplitDeque *localDeque,HighsTask *stolenTask)

{
  uint32_t *puVar1;
  element_type *peVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  HighsSplitDeque *stealer;
  HighsSplitDeque *local_30;
  
  bVar3 = HighsSplitDeque::leapfrogStolenTask(localDeque,stolenTask,&local_30);
  if (!bVar3) {
    iVar6 = (localDeque->ownerData).numWorkers * 0x10 + -0x10;
    lVar4 = std::chrono::_V2::system_clock::now();
    do {
      bVar3 = 0 < iVar6;
      iVar7 = iVar6;
      if (0 < iVar6) {
        do {
          if (((stolenTask->metadata).stealer.super___atomic_base<unsigned_long>._M_i & 1) != 0)
          goto LAB_0027d7ec;
          HighsSplitDeque::yield(localDeque);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        bVar3 = false;
      }
      lVar5 = std::chrono::_V2::system_clock::now();
      iVar6 = iVar6 << (lVar5 - lVar4 < 5000000);
    } while (lVar5 - lVar4 < 5000000);
    if (((stolenTask->metadata).stealer.super___atomic_base<unsigned_long>._M_i & 1) == 0) {
      HighsSplitDeque::waitForTaskToFinish(localDeque,stolenTask,local_30);
    }
    if (bVar3) {
      return;
    }
  }
LAB_0027d7ec:
  puVar1 = &(localDeque->ownerData).head;
  *puVar1 = *puVar1 - 1;
  if ((localDeque->ownerData).allStolenCopy == false) {
    (localDeque->ownerData).allStolenCopy = true;
    (localDeque->stealerData).allStolen._M_base._M_i = true;
    peVar2 = (localDeque->ownerData).workerBunk.
             super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    LOCK();
    (peVar2->haveJobs).super___atomic_base<int>._M_i =
         (peVar2->haveJobs).super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  return;
}

Assistant:

static void sync_stolen_task(HighsSplitDeque* localDeque,
                               HighsTask* stolenTask) {
    HighsSplitDeque* stealer;
    if (!localDeque->leapfrogStolenTask(stolenTask, stealer)) {
      const int numWorkers = localDeque->getNumWorkers();
      int numTries = HighsSchedulerConstants::kNumTryFac * (numWorkers - 1);

      auto tStart = std::chrono::high_resolution_clock::now();

      while (true) {
        for (int s = 0; s < numTries; ++s) {
          if (stolenTask->isFinished()) {
            localDeque->popStolen();
            return;
          }
          localDeque->yield();
        }

        auto numMicroSecs =
            std::chrono::duration_cast<std::chrono::microseconds>(
                std::chrono::high_resolution_clock::now() - tStart)
                .count();

        if (numMicroSecs < HighsSchedulerConstants::kMicroSecsBeforeSleep)
          numTries *= 2;
        else
          break;
      }

      if (!stolenTask->isFinished())
        localDeque->waitForTaskToFinish(stolenTask, stealer);
    }

    localDeque->popStolen();
  }